

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

void newsym(int x,int y)

{
  boolean bVar1;
  xchar x_00;
  byte bVar2;
  int iVar3;
  rm *prVar4;
  region *prVar5;
  obj *poVar6;
  trap *ptVar7;
  bool bVar8;
  monst *local_80;
  monst *local_70;
  bool local_52;
  bool local_51;
  monst *local_50;
  int tt;
  trap *trap;
  region *reg;
  int dy;
  int dx;
  xchar worm_tail;
  int see_it;
  rm *loc;
  monst *mon;
  int y_local;
  int x_local;
  xchar y_00;
  
  prVar4 = level->locations[x] + y;
  if (in_mklev != '\0') {
    return;
  }
  if ((u._1052_1_ & 1) != 0) {
    if (x != u.ux) {
      return;
    }
    if (y != u.uy) {
      return;
    }
    display_self();
    return;
  }
  if ((((byte)u._1052_1_ >> 1 & 1) != 0) &&
     (bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar1 == '\0')) {
    bVar1 = is_pool(level,x,y);
    if (bVar1 == '\0') {
      return;
    }
    reg._4_4_ = x - u.ux;
    if (reg._4_4_ < 0) {
      reg._4_4_ = -reg._4_4_;
    }
    reg._0_4_ = y - u.uy;
    if ((int)reg < 0) {
      reg._0_4_ = -(int)reg;
    }
    if (1 < reg._4_4_) {
      return;
    }
    if (1 < (int)reg) {
      return;
    }
  }
  x_00 = (xchar)x;
  y_00 = (xchar)y;
  if ((viz_array[y][x] & 2U) != 0) {
    prVar5 = visible_region_at(level,x_00,y_00);
    *(uint *)&prVar4->field_0x6 =
         *(uint *)&prVar4->field_0x6 & 0xfffff7ff |
         (uint)((*(uint *)&prVar4->field_0x6 >> 10 & 1) != 0) << 0xb;
    if ((x == u.ux) && (y == u.uy)) {
      if ((((((u.uprops[0x1e].intrinsic == 0) &&
             ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
           ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) && ((u._1052_1_ & 1) == 0))
         && (((((((u.uprops[0xd].intrinsic != 0 || (u.uprops[0xd].extrinsic != 0)) ||
                 (youmonst.data == mons + 0x9e)) || (youmonst.data == mons + 0x7b)) &&
               (((u.uprops[0xd].blocked == 0 && (u.uprops[0xc].intrinsic == 0)) &&
                ((u.uprops[0xc].extrinsic == 0 && (((youmonst.data)->mflags1 & 0x1000000) == 0))))))
              || (((byte)u._1052_1_ >> 2 & 1) != 0)) &&
             (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) &&
              ((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)))))))) {
        map_location(x,y,1);
      }
      else {
        map_location(x,y,0);
        display_self();
      }
      goto LAB_0018b98a;
    }
    if ((level->monsters[x][y] == (monst *)0x0) ||
       ((*(uint *)&level->monsters[x][y]->field_0x60 >> 9 & 1) != 0)) {
      local_50 = (monst *)0x0;
    }
    else {
      local_50 = level->monsters[x][y];
    }
    local_51 = false;
    if (local_50 != (monst *)0x0) {
      local_52 = true;
      if (x == local_50->mx) {
        local_52 = y != local_50->my;
      }
      local_51 = local_52;
    }
    bVar8 = false;
    if (local_50 != (monst *)0x0) {
      if (local_51 == false) {
        if ((((((*(uint *)&local_50->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0))
             && (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
           ((((*(uint *)&local_50->field_0x60 >> 7 & 1) != 0 ||
             ((*(uint *)&local_50->field_0x60 >> 9 & 1) != 0)) ||
            (bVar8 = true, ((byte)u._1052_1_ >> 5 & 1) != 0)))) {
          if (((local_50->data->mflags1 & 0x10000) == 0) &&
             ((poVar6 = which_armor(local_50,4), poVar6 == (obj *)0x0 ||
              (poVar6 = which_armor(local_50,4), poVar6->otyp != 0x4f)))) {
            if ((((u.uprops[0x1e].intrinsic != 0) ||
                 (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                  (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
                (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
                 ((((u.uprops[0x19].intrinsic != 0 ||
                    ((u.uprops[0x19].extrinsic != 0 || (youmonst.data == mons + 0x1e)))) ||
                   (youmonst.data == mons + 0x31)) || (youmonst.data == mons + 0x32)))))) &&
               (bVar8 = true, u.uprops[0x19].blocked == 0)) goto LAB_0018b785;
            if ((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) {
              iVar3 = dist2((int)local_50->mx,(int)local_50->my,(int)u.ux,(int)u.uy);
              bVar8 = true;
              if (iVar3 < 0x41) goto LAB_0018b785;
            }
          }
          bVar1 = match_warn_of_mon(local_50);
          bVar8 = bVar1 != '\0';
        }
      }
      else {
        bVar8 = true;
        if ((((*(uint *)&local_50->field_0x60 >> 1 & 1) != 0) &&
            (bVar8 = true, u.uprops[0xc].intrinsic == 0)) &&
           (bVar8 = true, u.uprops[0xc].extrinsic == 0)) {
          bVar8 = ((youmonst.data)->mflags1 & 0x1000000) != 0;
        }
      }
    }
LAB_0018b785:
    if ((local_50 == (monst *)0x0) ||
       ((!bVar8 &&
        ((local_51 != false || ((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0))))
        )))) {
      if (((local_50 == (monst *)0x0) ||
          (((u.uprops[0x18].intrinsic == 0 && (u.uprops[0x18].extrinsic == 0)) ||
           (((*(uint *)&local_50->field_0x60 >> 0x16 & 1) != 0 ||
            (iVar3 = dist2((int)local_50->mx,(int)local_50->my,(int)u.ux,(int)u.uy), 99 < iVar3)))))
          ) || ((local_50 != (monst *)0x0 && ((x != local_50->mx || (y != local_50->my)))))) {
        if ((*(uint *)&level->locations[x][y].field_0x6 >> 3 & 1) == 0) {
          map_location(x,y,1);
        }
        else {
          map_invisible(x_00,y_00);
        }
      }
      else {
        display_warning(local_50);
      }
    }
    else {
      if ((*(uint *)&local_50->field_0x60 >> 0x17 & 1) != 0) {
        ptVar7 = t_at(level,x,y);
        if (ptVar7 == (trap *)0x0) {
          bVar2 = 0;
        }
        else {
          bVar2 = ptVar7->field_0x8 & 0x1f;
        }
        if ((((bVar2 == 5) || (bVar2 == 0xb)) || (bVar2 == 0xc)) || (bVar2 == 0x13)) {
          ptVar7->field_0x8 = ptVar7->field_0x8 & 0xdf | 0x20;
        }
      }
      map_location(x,y,0);
      iVar3 = 2;
      if (bVar8) {
        iVar3 = 1;
      }
      display_monster(x_00,y_00,local_50,iVar3,local_51);
    }
LAB_0018b98a:
    if (prVar5 == (region *)0x0) {
      return;
    }
    if (prVar4->typ < '\x17') {
      return;
    }
    dbuf_set_effect(x,y,prVar5->effect_id);
    return;
  }
  if ((x == u.ux) && (y == u.uy)) {
    feel_location(u.ux,u.uy);
    if (((((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) && ((u._1052_1_ & 1) == 0)) &&
       ((((((u.uprops[0xd].intrinsic != 0 || (u.uprops[0xd].extrinsic != 0)) ||
           ((youmonst.data == mons + 0x9e || (youmonst.data == mons + 0x7b)))) &&
          ((((u.uprops[0xd].blocked == 0 && (u.uprops[0xc].intrinsic == 0)) &&
            (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)))) ||
         (((byte)u._1052_1_ >> 2 & 1) != 0)) &&
        (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) &&
         ((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)))))))) {
      return;
    }
    display_self();
    return;
  }
  if ((level->monsters[x][y] == (monst *)0x0) ||
     ((*(uint *)&level->monsters[x][y]->field_0x60 >> 9 & 1) != 0)) {
    local_70 = (monst *)0x0;
  }
  else {
    local_70 = level->monsters[x][y];
  }
  if (local_70 == (monst *)0x0) goto LAB_0018c041;
  if (((local_70->data->mflags1 & 0x10000) == 0) &&
     ((poVar6 = which_armor(local_70,4), poVar6 == (obj *)0x0 ||
      (poVar6 = which_armor(local_70,4), poVar6->otyp != 0x4f)))) {
    if ((((u.uprops[0x1e].intrinsic == 0) &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) ||
       (((((u.uprops[0x19].intrinsic == 0 &&
           ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
          (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)) ||
        (bVar8 = true, u.uprops[0x19].blocked != 0)))) {
      if ((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) {
        iVar3 = dist2((int)local_70->mx,(int)local_70->my,(int)u.ux,(int)u.uy);
        bVar8 = true;
        if (iVar3 < 0x41) goto LAB_0018bfb7;
      }
      goto LAB_0018bdd4;
    }
  }
  else {
LAB_0018bdd4:
    bVar1 = match_warn_of_mon(local_70);
    bVar8 = true;
    if ((bVar1 == '\0') &&
       ((((u.uprops[0x1e].intrinsic == 0 &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((bVar8 = false, ublindf != (obj *)0x0 && (bVar8 = false, ublindf->oartifact == '\x1d'))))
        && (((u.uprops[0x40].intrinsic != 0 ||
             ((u.uprops[0x40].extrinsic != 0 ||
              (bVar8 = false, ((youmonst.data)->mflags3 & 0x100) != 0)))) &&
            (((bVar8 = false, (local_70->data->mflags3 & 0x200) != 0 &&
              (bVar8 = false, (viz_array[local_70->my][local_70->mx] & 1U) != 0)) &&
             ((((((*(uint *)&local_70->field_0x60 >> 1 & 1) == 0 || (u.uprops[0xc].intrinsic != 0))
                || (u.uprops[0xc].extrinsic != 0)) ||
               (bVar8 = false, ((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
              (bVar8 = false, (*(uint *)&local_70->field_0x60 >> 7 & 1) == 0)))))))))) {
      bVar8 = (*(uint *)&local_70->field_0x60 >> 9 & 1) == 0 && ((byte)u._1052_1_ >> 5 & 1) == 0;
    }
  }
LAB_0018bfb7:
  if ((((bVar8) || (u.uprops[0x42].intrinsic != 0)) || (u.uprops[0x42].extrinsic != 0)) &&
     ((local_70 == (monst *)0x0 || ((x == local_70->mx && (y == local_70->my)))))) {
    iVar3 = 2;
    if (bVar8) {
      iVar3 = 0;
    }
    display_monster(x_00,y_00,local_70,iVar3,'\0');
    return;
  }
LAB_0018c041:
  if ((level->monsters[x][y] == (monst *)0x0) ||
     ((*(uint *)&level->monsters[x][y]->field_0x60 >> 9 & 1) != 0)) {
    local_80 = (monst *)0x0;
  }
  else {
    local_80 = level->monsters[x][y];
  }
  if ((((local_80 != (monst *)0x0) &&
       (((u.uprops[0x18].intrinsic != 0 || (u.uprops[0x18].extrinsic != 0)) &&
        ((*(uint *)&local_80->field_0x60 >> 0x16 & 1) == 0)))) &&
      (iVar3 = dist2((int)local_80->mx,(int)local_80->my,(int)u.ux,(int)u.uy), iVar3 < 100)) &&
     ((local_80 == (monst *)0x0 || ((x == local_80->mx && (y == local_80->my)))))) {
    display_warning(local_80);
    return;
  }
  if ((*(uint *)&prVar4->field_0x6 >> 0xb & 1) == 0) {
    if ((((undefined1  [12])*prVar4 & (undefined1  [12])0x3f) == (undefined1  [12])0xe) &&
       (prVar4->typ == '\x18')) {
      *(uint *)prVar4 = *(uint *)prVar4 & 0xffffffc0 | 0xd;
      *(uint *)&prVar4->field_0x6 = *(uint *)&prVar4->field_0x6 & 0xfffffffe;
      *(uint *)&prVar4->field_0x6 = *(uint *)&prVar4->field_0x6 & 0xfffffffd;
      dbuf_set_loc(x,y);
      return;
    }
    if ((((undefined1  [12])*prVar4 & (undefined1  [12])0x3f) == (undefined1  [12])0xf) &&
       (prVar4->typ == '\x19')) {
      *(uint *)prVar4 = *(uint *)prVar4 & 0xffffffc0 | 0x10;
      *(uint *)&prVar4->field_0x6 = *(uint *)&prVar4->field_0x6 & 0xfffffffe;
      *(uint *)&prVar4->field_0x6 = *(uint *)&prVar4->field_0x6 & 0xfffffffd;
      dbuf_set_loc(x,y);
      return;
    }
  }
  dbuf_set_loc(x,y);
  return;
}

Assistant:

void newsym(int x, int y)
{
    struct monst *mon;
    struct rm *loc = &(level->locations[x][y]);
    int see_it;
    xchar worm_tail;

    if (in_mklev) return;

    /* only permit updating the hero when swallowed */
    if (u.uswallow) {
	if (x == u.ux && y == u.uy) display_self();
	return;
    }
    if (Underwater && !Is_waterlevel(&u.uz)) {
	/* don't do anything unless (x,y) is an adjacent underwater position */
	int dx, dy;
	if (!is_pool(level, x,y)) return;
	dx = x - u.ux;	if (dx < 0) dx = -dx;
	dy = y - u.uy;	if (dy < 0) dy = -dy;
	if (dx > 1 || dy > 1) return;
    }

    /* Can physically see the location. */
    if (cansee(x,y)) {
        struct region* reg = visible_region_at(level, x, y);
	/*
	 * Don't use templit here:  E.g.
	 *
	 *	loc->waslit = !!(loc->lit || templit(x,y));
	 *
	 * Otherwise we have the "light pool" problem, where non-permanently
	 * lit areas just out of sight stay remembered as lit.  They should
	 * re-darken.
	 *
	 * Perhaps ALL areas should revert to their "unlit" look when
	 * out of sight.
	 */
	loc->waslit = (loc->lit!=0);	/* remember lit condition */

	if (x == u.ux && y == u.uy) {
	    if (senseself()) {
		map_location(x,y,0);	/* map *under* self */
		display_self();
	    } else
		/* we can see what is there */
		map_location(x,y,1);
	}
	else {
	    mon = m_at(level, x,y);
	    worm_tail = is_worm_tail(mon);
	    see_it = mon && (worm_tail
		? (!mon->minvis || See_invisible)
		: (mon_visible(mon)) || tp_sensemon(mon) || match_warn_of_mon(mon));
	    if (mon && (see_it || (!worm_tail && Detect_monsters))) {
		if (mon->mtrapped) {
		    struct trap *trap = t_at(level, x, y);
		    int tt = trap ? trap->ttyp : NO_TRAP;

		    /* if monster is in a physical trap, you see the trap too */
		    if (tt == BEAR_TRAP || tt == PIT ||
			tt == SPIKED_PIT ||tt == WEB) {
			trap->tseen = TRUE;
		    }
		}
		map_location(x,y,0);	/* map under the monster */
		/* also gets rid of any invisibility glyph */
		display_monster(x, y, mon, see_it ? PHYSICALLY_SEEN : DETECTED, worm_tail);
	    }
	    else if (mon && mon_warning(mon) && !is_worm_tail(mon))
	        display_warning(mon);
	    else if (level->locations[x][y].mem_invis)
		map_invisible(x, y);
	    else
		map_location(x,y,1);	/* map the location */
	}
	
	if (reg != NULL && ACCESSIBLE(loc->typ))
	    dbuf_set_effect(x, y, reg->effect_id);
    }

    /* Can't see the location. */
    else {
	if (x == u.ux && y == u.uy) {
	    feel_location(u.ux, u.uy);		/* forces an update */

	    if (senseself())
		display_self();
	}
	else if ((mon = m_at(level, x,y))
		&& ((see_it = (tp_sensemon(mon) || match_warn_of_mon(mon)
		    		|| (see_with_infrared(mon) && mon_visible(mon))))
		    || Detect_monsters)
		&& !is_worm_tail(mon)) {
	    /* Monsters are printed every time. */
	    /* This also gets rid of any invisibility glyph */
	    display_monster(x, y, mon, see_it ? 0 : DETECTED, 0);
	}
	else if ((mon = m_at(level, x,y)) && mon_warning(mon) &&
		 !is_worm_tail(mon)) {
	        display_warning(mon);
	}		

	/*
	 * If the location is remembered as being both dark (waslit is false)
	 * and lit (glyph is a lit room or lit corridor) then it was either:
	 *
	 *	(1) A dark location that the hero could see through night
	 *	    vision.
	 *
	 *	(2) Darkened while out of the hero's sight.  This can happen
	 *	    when cursed scroll of light is read.
	 *
	 * In either case, we have to manually correct the hero's memory to
	 * match waslit.  Deciding when to change waslit is non-trivial.
	 *
	 *  Note:  If flags.lit_corridor is set, then corridors act like room
	 *	   squares.  That is, they light up if in night vision range.
	 *	   If flags.lit_corridor is not set, then corridors will
	 *	   remain dark unless lit by a light spell and may darken
	 *	   again, as discussed above.
	 *
	 * These checks and changes must be here and not in back_to_glyph().
	 * They are dependent on the position being out of sight.
	 */
	else if (!loc->waslit) {
	    if (loc->mem_bg == S_litcorr && loc->typ == CORR) {
		loc->mem_bg = S_corr;
		loc->mem_door_l = 0;
		loc->mem_door_t = 0;
		dbuf_set_loc(x, y);
	    } else if (loc->mem_bg == S_room && loc->typ == ROOM) {
		loc->mem_bg = S_darkroom;
		loc->mem_door_l = 0;
		loc->mem_door_t = 0;
		dbuf_set_loc(x, y);
	    }
	    else
		goto show_mem;
	} else {
show_mem:
	    dbuf_set_loc(x, y);
	}
    }
}